

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void __thiscall
dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor
          (CFGStructurizer *this,CFGNode *anchor,CFGNode *common_pdom,Vector<CFGNode_*> *constructs)

{
  pointer ppCVar1;
  CFGNode *pCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  bool bVar7;
  uint32_t uVar8;
  Id IVar9;
  Builder *this_00;
  CFGNode *to;
  CFGNode *this_01;
  CFGNode *this_02;
  CFGNode *to_00;
  CFGNode *to_01;
  size_t i_3;
  ulong uVar10;
  size_t i_1;
  ulong uVar11;
  IRBlock *this_03;
  size_t i;
  ulong uVar12;
  undefined8 local_f0;
  Id local_e8;
  pointer local_e0;
  pointer pIStack_d8;
  pointer local_d0;
  CFGNode *local_c8;
  CFGNode *local_c0;
  undefined8 local_b8;
  Id local_b0;
  pointer local_a8;
  pointer pIStack_a0;
  pointer local_98;
  PHI local_90;
  undefined1 local_68 [16];
  _Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
  local_58;
  IncomingValue local_40;
  
  this_00 = SPIRVModule::get_builder(this->module);
  if ((anchor->ir).terminator.type != Condition) {
    __assert_fail("anchor->ir.terminator.type == Terminator::Type::Condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x16cf,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  ppCVar1 = (constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 != 0x10) {
    __assert_fail("constructs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x16d0,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  bVar7 = CFGNode::post_dominates(*ppCVar1,(anchor->ir).terminator.true_block);
  if (!bVar7) {
    bVar7 = CFGNode::post_dominates
                      (*(constructs->
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                       (anchor->ir).terminator.false_block);
    if (!bVar7) {
      __assert_fail("constructs[0]->post_dominates(anchor->ir.terminator.true_block) || constructs[0]->post_dominates(anchor->ir.terminator.false_block)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x16d2,
                    "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                   );
    }
  }
  bVar7 = CFGNode::post_dominates
                    ((constructs->
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[1],
                     (anchor->ir).terminator.true_block);
  if (!bVar7) {
    bVar7 = CFGNode::post_dominates
                      ((constructs->
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[1],
                       (anchor->ir).terminator.false_block);
    if (!bVar7) {
      __assert_fail("constructs[1]->post_dominates(anchor->ir.terminator.true_block) || constructs[1]->post_dominates(anchor->ir.terminator.false_block)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x16d4,
                    "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                   );
    }
  }
  to = create_helper_pred_block(this,anchor);
  this_01 = CFGNodePool::create_node(this->pool);
  this_02 = CFGNodePool::create_node(this->pool);
  to_00 = CFGNodePool::create_node(this->pool);
  to_01 = CFGNodePool::create_node(this->pool);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_68,&anchor->name,".anchor0");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&this_01->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_68,&anchor->name,".anchor1");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&this_02->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_68);
  this_01->immediate_dominator = anchor;
  this_02->immediate_dominator = anchor;
  ppCVar1 = (constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  this_01->immediate_post_dominator = *ppCVar1;
  pCVar2 = ppCVar1[1];
  this_02->immediate_post_dominator = pCVar2;
  uVar8 = (*ppCVar1)->backward_post_visit_order;
  this_01->forward_post_visit_order = (*ppCVar1)->forward_post_visit_order;
  this_01->backward_post_visit_order = uVar8;
  uVar8 = pCVar2->backward_post_visit_order;
  this_02->forward_post_visit_order = pCVar2->forward_post_visit_order;
  this_02->backward_post_visit_order = uVar8;
  local_c0 = this_02;
  CFGNode::add_branch(this_01,to_00);
  CFGNode::add_branch(this_02,to_00);
  (this_01->ir).terminator.type = Branch;
  (this_01->ir).terminator.direct_block = to_00;
  (this_02->ir).terminator.type = Branch;
  (this_02->ir).terminator.direct_block = to_00;
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_68,&anchor->name,".anchor-term");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&to_00->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_68);
  CFGNode::add_branch(to_00,to_01);
  (to_00->ir).terminator.type = Branch;
  (to_00->ir).terminator.direct_block = to_01;
  local_c8 = to_00;
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_68,&anchor->name,".anchor-dispatch");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&to_01->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_68);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68[8] = false;
  local_68._0_4_ = SPIRVModule::allocate_id(this->module);
  local_68._4_4_ = spv::Builder::makeBoolType(this_00);
  local_90._0_8_ = this_01;
  local_90._8_4_ = spv::Builder::makeBoolConstant(this_00,true,false);
  std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
  emplace_back<dxil_spv::IncomingValue>
            ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              *)&local_58,(IncomingValue *)&local_90);
  pCVar2 = local_c0;
  local_90._0_8_ = local_c0;
  local_90._8_4_ = spv::Builder::makeBoolConstant(this_00,false,false);
  std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
  emplace_back<dxil_spv::IncomingValue>
            ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              *)&local_58,(IncomingValue *)&local_90);
  traverse_dominated_blocks_and_rewrite_branch
            (this,anchor,
             *(constructs->
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              )._M_impl.super__Vector_impl_data._M_start,this_01);
  traverse_dominated_blocks_and_rewrite_branch
            (this,anchor,
             (constructs->
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1],pCVar2);
  ppCVar1 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = *(constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  traverse_dominated_blocks_and_rewrite_branch(this,pCVar2->immediate_dominator,pCVar2,to);
  ppCVar4 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar5 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (constructs->
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  traverse_dominated_blocks_and_rewrite_branch(this,pCVar2->immediate_dominator,pCVar2,to);
  ppCVar6 = (constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = *ppCVar6;
  if ((pCVar2->pred).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(pCVar2->pred).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl + 8)) {
    pCVar2 = ppCVar6[1];
    if ((pCVar2->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        *(pointer *)
         ((long)&(pCVar2->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl + 8)) {
      uVar11 = (long)ppCVar1 - (long)ppCVar3 >> 3;
      uVar10 = (long)ppCVar4 - (long)ppCVar5 >> 3;
      local_90.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90._8_4_ = local_90._8_4_ & 0xffffff00;
      uVar8 = SPIRVModule::allocate_id(this->module);
      local_90.id = uVar8;
      IVar9 = spv::Builder::makeBoolType(this_00);
      local_90.type_id = IVar9;
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        local_f0 = (to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12];
        local_e8 = spv::Builder::makeBoolConstant(this_00,true,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        emplace_back<dxil_spv::IncomingValue>(&local_90.incoming,(IncomingValue *)&local_f0);
      }
      for (; ppCVar1 = (to->pred).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
          uVar11 < (ulong)((long)(to->pred).
                                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
          uVar11 = uVar11 + 1) {
        local_f0 = ppCVar1[uVar11];
        local_e8 = spv::Builder::makeBoolConstant(this_00,false,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        emplace_back<dxil_spv::IncomingValue>(&local_90.incoming,(IncomingValue *)&local_f0);
      }
      CFGNode::add_branch(to,anchor);
      CFGNode::add_branch(to,to_01);
      (to->ir).terminator.type = Condition;
      (to->ir).terminator.true_block = anchor;
      (to->ir).terminator.false_block = to_01;
      (to->ir).terminator.direct_block = (CFGNode *)0x0;
      (to->ir).terminator.conditional_id = local_90.id;
      local_d0 = (pointer)0x0;
      local_e0 = (pointer)0x0;
      pIStack_d8 = (pointer)0x0;
      local_e8 = local_e8 & 0xffffff00;
      uVar8 = SPIRVModule::allocate_id(this->module);
      local_f0._0_4_ = uVar8;
      IVar9 = spv::Builder::makeBoolType(this_00);
      local_f0._4_4_ = IVar9;
      for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        local_b8 = (to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11];
        local_b0 = spv::Builder::makeBoolConstant(this_00,true,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        emplace_back<dxil_spv::IncomingValue>
                  ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                    *)&local_e0,(IncomingValue *)&local_b8);
      }
      for (; ppCVar1 = (to->pred).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
          uVar10 < (ulong)((long)(to->pred).
                                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
          uVar10 = uVar10 + 1) {
        local_b8 = ppCVar1[uVar10];
        local_b0 = spv::Builder::makeBoolConstant(this_00,false,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        emplace_back<dxil_spv::IncomingValue>
                  ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                    *)&local_e0,(IncomingValue *)&local_b8);
      }
      this_03 = &local_c8->ir;
      local_98 = (pointer)0x0;
      local_a8 = (pointer)0x0;
      pIStack_a0 = (pointer)0x0;
      local_b0 = local_b0 & 0xffffff00;
      uVar8 = SPIRVModule::allocate_id(this->module);
      local_b8._0_4_ = uVar8;
      IVar9 = spv::Builder::makeBoolType(this_00);
      local_b8._4_4_ = IVar9;
      local_40.id = local_68._0_4_;
      local_40.block = anchor;
      std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::emplace_back<dxil_spv::IncomingValue>
                ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                  *)&local_a8,&local_40);
      local_40.id = (uint32_t)local_f0;
      local_40.block = to;
      std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::emplace_back<dxil_spv::IncomingValue>
                ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                  *)&local_a8,&local_40);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&(to->ir).phi,&local_90);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&(to->ir).phi,(PHI *)&local_f0);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&this_03->phi,(PHI *)local_68);
      (to_01->ir).terminator.conditional_id = (uint32_t)local_b8;
      (to_01->ir).terminator.type = Condition;
      ppCVar1 = (constructs->
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      (to_01->ir).terminator.true_block = *ppCVar1;
      (to_01->ir).terminator.false_block = ppCVar1[1];
      CFGNode::add_branch(to_01,*ppCVar1);
      CFGNode::add_branch(to_01,(constructs->
                                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[1]);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&(to_01->ir).phi,(PHI *)&local_b8);
      std::
      _Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::~_Vector_base((_Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       *)&local_a8);
      std::
      _Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::~_Vector_base((_Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       *)&local_e0);
      std::
      _Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::~_Vector_base(&local_90.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     );
      std::
      _Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::~_Vector_base(&local_58);
      return;
    }
    __assert_fail("constructs[1]->pred.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x1704,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  __assert_fail("constructs[0]->pred.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                ,0x1703,
                "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
               );
}

Assistant:

void CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(
	CFGNode *anchor, CFGNode *common_pdom, const Vector<CFGNode *> &constructs)
{
	auto &builder = module.get_builder();

	// If we have an anchor, it should collect all control flow, maybe dispatch itself, then dispatch to the constructs.
	// It must be a conditional branch, since it's too much of a mess to deal with switch.
	assert(anchor->ir.terminator.type == Terminator::Type::Condition);
	assert(constructs.size() == 2);
	assert(constructs[0]->post_dominates(anchor->ir.terminator.true_block) ||
	       constructs[0]->post_dominates(anchor->ir.terminator.false_block));
	assert(constructs[1]->post_dominates(anchor->ir.terminator.true_block) ||
	       constructs[1]->post_dominates(anchor->ir.terminator.false_block));

	auto *anchor_pred = create_helper_pred_block(anchor);

	auto *anchor_to_construct0 = pool.create_node();
	auto *anchor_to_construct1 = pool.create_node();
	auto *anchor_terminator = pool.create_node();
	auto *anchor_dispatcher = pool.create_node();

	anchor_to_construct0->name = anchor->name + ".anchor0";
	anchor_to_construct1->name = anchor->name + ".anchor1";

	anchor_to_construct0->immediate_dominator = anchor;
	anchor_to_construct1->immediate_dominator = anchor;
	anchor_to_construct0->immediate_post_dominator = constructs[0];
	anchor_to_construct1->immediate_post_dominator = constructs[1];
	anchor_to_construct0->forward_post_visit_order = constructs[0]->forward_post_visit_order;
	anchor_to_construct1->forward_post_visit_order = constructs[1]->forward_post_visit_order;
	anchor_to_construct0->backward_post_visit_order = constructs[0]->backward_post_visit_order;
	anchor_to_construct1->backward_post_visit_order = constructs[1]->backward_post_visit_order;

	anchor_to_construct0->add_branch(anchor_terminator);
	anchor_to_construct1->add_branch(anchor_terminator);
	anchor_to_construct0->ir.terminator.type = Terminator::Type::Branch;
	anchor_to_construct0->ir.terminator.direct_block = anchor_terminator;
	anchor_to_construct1->ir.terminator.type = Terminator::Type::Branch;
	anchor_to_construct1->ir.terminator.direct_block = anchor_terminator;
	anchor_terminator->name = anchor->name + ".anchor-term";
	anchor_terminator->add_branch(anchor_dispatcher);
	anchor_terminator->ir.terminator.type = Terminator::Type::Branch;
	anchor_terminator->ir.terminator.direct_block = anchor_dispatcher;
	anchor_dispatcher->name = anchor->name + ".anchor-dispatch";

	PHI terminator_selector;
	terminator_selector.id = module.allocate_id();
	terminator_selector.type_id = builder.makeBoolType();
	terminator_selector.incoming.push_back({ anchor_to_construct0, builder.makeBoolConstant(true) });
	terminator_selector.incoming.push_back({ anchor_to_construct1, builder.makeBoolConstant(false) });

	traverse_dominated_blocks_and_rewrite_branch(anchor, constructs[0], anchor_to_construct0);
	traverse_dominated_blocks_and_rewrite_branch(anchor, constructs[1], anchor_to_construct1);

	size_t cutoff_normal_path = anchor_pred->pred.size();
	traverse_dominated_blocks_and_rewrite_branch(constructs[0]->immediate_dominator, constructs[0], anchor_pred);
	size_t cutoff_path0 = anchor_pred->pred.size();
	traverse_dominated_blocks_and_rewrite_branch(constructs[1]->immediate_dominator, constructs[1], anchor_pred);

	assert(constructs[0]->pred.empty());
	assert(constructs[1]->pred.empty());

	// Branch to anchor as normal if we have a pre-existing pred.
	PHI take_anchor_phi;
	take_anchor_phi.id = module.allocate_id();
	take_anchor_phi.type_id = builder.makeBoolType();
	for (size_t i = 0; i < cutoff_normal_path; i++)
		take_anchor_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(true) });
	for (size_t i = cutoff_normal_path; i < anchor_pred->pred.size(); i++)
		take_anchor_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(false) });

	anchor_pred->add_branch(anchor);
	anchor_pred->add_branch(anchor_dispatcher);
	anchor_pred->ir.terminator.type = Terminator::Type::Condition;
	anchor_pred->ir.terminator.true_block = anchor;
	anchor_pred->ir.terminator.false_block = anchor_dispatcher;
	anchor_pred->ir.terminator.direct_block = nullptr;
	anchor_pred->ir.terminator.conditional_id = take_anchor_phi.id;

	PHI outside_true_phi;
	outside_true_phi.id = module.allocate_id();
	outside_true_phi.type_id = builder.makeBoolType();
	for (size_t i = 0; i < cutoff_path0; i++)
		outside_true_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(true) });
	for (size_t i = cutoff_path0; i < anchor_pred->pred.size(); i++)
		outside_true_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(false) });

	PHI anchor_cond_phi;
	anchor_cond_phi.id = module.allocate_id();
	anchor_cond_phi.type_id = builder.makeBoolType();
	// If we took the path through anchor, use that conditional. Otherwise, use the selector between path 0 or 1.
	anchor_cond_phi.incoming.push_back({ anchor, terminator_selector.id });
	anchor_cond_phi.incoming.push_back({ anchor_pred, outside_true_phi.id });

	anchor_pred->ir.phi.push_back(std::move(take_anchor_phi));
	anchor_pred->ir.phi.push_back(std::move(outside_true_phi));
	anchor_terminator->ir.phi.push_back(std::move(terminator_selector));
	anchor_dispatcher->ir.terminator.conditional_id = anchor_cond_phi.id;
	anchor_dispatcher->ir.terminator.type = Terminator::Type::Condition;
	anchor_dispatcher->ir.terminator.true_block = constructs[0];
	anchor_dispatcher->ir.terminator.false_block = constructs[1];
	anchor_dispatcher->add_branch(constructs[0]);
	anchor_dispatcher->add_branch(constructs[1]);
	anchor_dispatcher->ir.phi.push_back(std::move(anchor_cond_phi));
}